

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void eye(double *mat,int N)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  pdVar3 = mat;
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; (uint)N != uVar4; uVar4 = uVar4 + 1) {
      if (uVar1 == uVar4) {
        mat[uVar1 + uVar1 * (long)N] = 1.0;
      }
      else {
        pdVar3[uVar4] = 0.0;
      }
    }
    pdVar3 = pdVar3 + N;
  }
  return;
}

Assistant:

void eye(double *mat,int N) {
	int i,j,t;
	for(i = 0;i < N;++i) {
		for(j =0; j < N;++j) {
			t = i*N;
			if (i == j) {
				mat[t+j] = 1.;
			} else {
				mat[t+j] = 0.;
			}
		}
		
	}
}